

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileTimeComparison.cxx
# Opt level: O0

bool __thiscall
cmFileTimeComparisonInternal::FileTimesDiffer(cmFileTimeComparisonInternal *this,char *f1,char *f2)

{
  bool bVar1;
  undefined1 local_148 [8];
  stat s2;
  stat s1;
  char *f2_local;
  char *f1_local;
  cmFileTimeComparisonInternal *this_local;
  
  bVar1 = Stat(this,f1,(stat *)(s2.__glibc_reserved + 2));
  if ((bVar1) && (bVar1 = Stat(this,f2,(stat *)local_148), bVar1)) {
    this_local._7_1_ = TimesDiffer(this,(stat *)(s2.__glibc_reserved + 2),(stat *)local_148);
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool cmFileTimeComparisonInternal::FileTimesDiffer(const char* f1,
                                                   const char* f2)
{
  // Get the modification time for each file.
  cmFileTimeComparison_Type s1;
  cmFileTimeComparison_Type s2;
  if(this->Stat(f1, &s1) &&
     this->Stat(f2, &s2))
    {
    // Compare the two modification times.
    return this->TimesDiffer(&s1, &s2);
    }
  else
    {
    // No comparison available.  Default to different times.
    return true;
    }
}